

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  byte *pbVar1;
  float fVar2;
  char cVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  uint uVar12;
  ImGuiID id;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int order_n;
  int iVar20;
  ulong uVar21;
  int order_n_1;
  uint uVar22;
  uint uVar23;
  ImGuiTableColumn *pIVar24;
  bool bVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  int local_a0;
  float local_9c;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar8 = GImGui;
  uVar22 = table->Flags;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar28 = (pIVar8->Style).FramePadding.x;
  fVar27 = 1.0;
  if (1.0 <= fVar28) {
    fVar27 = fVar28;
  }
  table->MinColumnWidth = fVar27;
  uVar21 = 0;
  uVar26 = 0xffffffff;
  fVar28 = 0.0;
  local_9c = 0.0;
  bVar11 = false;
  bVar6 = false;
  local_a0 = 0;
  cVar10 = '\0';
  uVar12 = uVar22;
  while( true ) {
    uVar23 = table->ColumnsCount;
    if ((long)(int)uVar23 <= (long)uVar21) break;
    bVar13 = (table->DisplayOrderToIndex).Data[uVar21];
    uVar23 = (uint)(char)bVar13;
    if (uVar21 != uVar23) {
      table->IsDefaultDisplayOrder = false;
    }
    pIVar24 = (table->Columns).Data + (char)bVar13;
    if (table->DeclColumnsCount <= (char)bVar13) {
      TableSetupColumnFlags(table,pIVar24,0);
      pIVar24->NameOffset = -1;
      pIVar24->UserID = 0;
      pIVar24->InitStretchWeightOrWidth = -1.0;
      uVar12 = table->Flags;
    }
    if (((uVar12 & 4) == 0) || ((pIVar24->Flags & 0x80) != 0)) {
      pIVar24->IsUserEnabledNextFrame = true;
      bVar9 = true;
    }
    else {
      bVar9 = pIVar24->IsUserEnabledNextFrame;
    }
    if (pIVar24->IsUserEnabled != bVar9) {
      pIVar24->IsUserEnabled = bVar9;
      table->IsSettingsDirty = true;
    }
    uVar4 = pIVar24->Flags;
    bVar9 = (bool)(bVar9 & (uVar4 & 1) == 0);
    pIVar24->IsEnabled = bVar9;
    if (((uVar12 >> 0x1a & 1) == 0 && '\0' < pIVar24->SortOrder) ||
       (pIVar24->SortOrder != -1 && bVar9 == false)) {
      table->IsSortSpecsDirty = true;
    }
    if ((&pIVar24->WidthRequest)[(ulong)((uVar4 & 0x10) == 0) * 2] <= 0.0 &&
        (&pIVar24->WidthRequest)[(ulong)((uVar4 & 0x10) == 0) * 2] != 0.0) {
      pIVar24->AutoFitQueue = '\a';
      pIVar24->CannotSkipItemsQueue = '\a';
    }
    if (bVar9 == false) {
      pIVar24->IndexWithinEnabledSet = -1;
    }
    else {
      pIVar24->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar26;
      pIVar24->NextEnabledColumn = -1;
      if (uVar26 == 0xffffffff) {
        table->LeftMostEnabledColumn = bVar13;
      }
      else {
        (table->Columns).Data[(int)uVar26].NextEnabledColumn = bVar13;
      }
      cVar3 = table->ColumnsEnabledCount;
      table->ColumnsEnabledCount = cVar3 + '\x01';
      pIVar24->IndexWithinEnabledSet = cVar3;
      table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar13 & 0x3f);
      table->EnabledMaskByDisplayOrder =
           table->EnabledMaskByDisplayOrder | 1L << (pIVar24->DisplayOrder & 0x3fU);
      if (pIVar24->IsPreserveWidthAuto == false) {
        fVar27 = TableGetColumnWidthAuto(table,pIVar24);
        pIVar24->WidthAuto = fVar27;
      }
      if ((uVar4 & 0x20) == 0) {
        bVar11 = true;
      }
      if (((uVar4 & 0x10) != 0) && (0.0 < pIVar24->InitStretchWeightOrWidth && (uVar4 & 0x20) != 0))
      {
        pIVar24->WidthAuto = pIVar24->InitStretchWeightOrWidth;
      }
      bVar6 = (bool)(bVar6 | pIVar24->AutoFitQueue != '\0');
      fVar27 = pIVar24->WidthAuto;
      uVar26 = uVar23;
      if ((uVar4 & 8) == 0) {
        fVar28 = (float)((uint)fVar28 & -(uint)(fVar27 <= fVar28) |
                        ~-(uint)(fVar27 <= fVar28) & (uint)fVar27);
        cVar10 = cVar10 + '\x01';
      }
      else {
        local_9c = local_9c + fVar27;
        local_a0 = local_a0 + 1;
      }
    }
    uVar21 = uVar21 + 1;
  }
  uVar21 = (ulong)uVar23;
  if ((((uVar12 & 8) != 0) && ((uVar12 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar26;
  if (bVar6) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  uVar22 = uVar22 & 0xe000;
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  uVar14 = 0;
  uVar15 = 0;
  if (0 < (int)uVar23) {
    uVar15 = (ulong)uVar23;
  }
  uVar18 = 0xff;
  lVar17 = 99;
  uVar19 = 0xff;
  uVar16 = 0xff;
  fVar27 = 0.0;
  fVar29 = 0.0;
  for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    bVar13 = (byte)uVar14;
    if ((table->EnabledMaskByIndex >> (uVar14 & 0x3f) & 1) != 0) {
      pIVar24 = (table->Columns).Data;
      uVar26 = *(uint *)((long)pIVar24 + lVar17 + -99);
      if ((uVar26 & 0x10) == 0) {
        if ((((uVar26 & 0x20) != 0) || (*(char *)((long)&pIVar24->Flags + lVar17) != '\0')) ||
           (fVar30 = *(float *)((long)pIVar24 + lVar17 + -0x4b), fVar30 < 0.0)) {
          fVar30 = *(float *)((long)pIVar24 + lVar17 + -0x47);
          bVar6 = fVar30 <= 0.0;
          if (fVar30 <= 0.0) {
            fVar30 = 1.0;
          }
          if (bVar6 && uVar22 == 0x6000) {
            fVar30 = (*(float *)((long)pIVar24 + lVar17 + -0x4f) / local_9c) * (float)local_a0;
          }
          *(float *)((long)pIVar24 + lVar17 + -0x4b) = fVar30;
        }
        if (((char)uVar19 == -1) ||
           (uVar16 = uVar19,
           *(char *)((long)pIVar24 + lVar17 + -0x11) < pIVar24[(char)uVar19].DisplayOrder)) {
          table->LeftMostStretchedColumn = bVar13;
          uVar16 = uVar14 & 0xffffffff;
        }
        fVar27 = fVar27 + fVar30;
        uVar19 = uVar16;
        if (((char)uVar18 == -1) ||
           (pIVar24[(char)uVar18].DisplayOrder < *(char *)((long)pIVar24 + lVar17 + -0x11))) {
          table->RightMostStretchedColumn = bVar13;
          uVar18 = uVar14 & 0xffffffff;
        }
      }
      else {
        cVar3 = *(char *)((long)&pIVar24->Flags + lVar17);
        if (uVar22 == 0x4000) {
          fVar30 = fVar28;
          if ((uVar26 & 0x20) != 0 || cVar3 != '\0') goto LAB_001441f2;
        }
        else {
          fVar30 = *(float *)((long)pIVar24 + lVar17 + -0x4f);
LAB_001441f2:
          if (cVar3 == '\0') {
            if (((uVar26 & 0x20) != 0) &&
               ((table->RequestOutputMaskByIndex & 1L << (bVar13 & 0x3f)) != 0)) {
              *(float *)((long)pIVar24 + lVar17 + -0x53) = fVar30;
            }
          }
          else {
            *(float *)((long)pIVar24 + lVar17 + -0x53) = fVar30;
            if (((cVar3 != '\x01') && (table->IsInitializing == true)) &&
               (*(char *)((long)pIVar24 + lVar17 + -2) == '\0')) {
              fVar33 = table->MinColumnWidth * 4.0;
              uVar26 = -(uint)(fVar33 <= fVar30);
              *(uint *)((long)pIVar24 + lVar17 + -0x53) =
                   ~uVar26 & (uint)fVar33 | (uint)fVar30 & uVar26;
            }
          }
        }
        fVar29 = fVar29 + *(float *)((long)pIVar24 + lVar17 + -0x53);
      }
      *(undefined1 *)((long)pIVar24 + lVar17 + -2) = 0;
      fVar29 = fVar29 + table->CellPaddingX + table->CellPaddingX;
    }
    lVar17 = lVar17 + 0x68;
  }
  table->ColumnsEnabledFixedCount = cVar10;
  fVar28 = (table->WorkRect).Min.x;
  fVar30 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar12 >> 0x18 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar33 = (table->WorkRect).Max.x - fVar28;
  }
  else {
    fVar33 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar2 = (table->WorkRect).Min.y;
  fVar29 = (fVar33 - fVar30) - fVar29;
  fVar30 = (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) +
           fVar30;
  table->ColumnsGivenWidth = fVar30;
  lVar17 = 0;
  fVar33 = fVar29;
  for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    if ((table->EnabledMaskByIndex >> (uVar14 & 0x3f) & 1) != 0) {
      pIVar24 = (table->Columns).Data;
      uVar22 = *(uint *)((long)&pIVar24->Flags + lVar17);
      if ((uVar22 & 8) != 0) {
        fVar31 = (*(float *)((long)&pIVar24->StretchWeight + lVar17) / fVar27) * fVar29;
        uVar26 = -(uint)(table->MinColumnWidth <= fVar31);
        fVar31 = (float)(int)((float)(~uVar26 & (uint)table->MinColumnWidth | (uint)fVar31 & uVar26)
                             + 0.01);
        *(float *)((long)&pIVar24->WidthRequest + lVar17) = fVar31;
        fVar33 = fVar33 - fVar31;
      }
      if (((&pIVar24->NextEnabledColumn)[lVar17] == -1) && ((char)uVar16 != -1)) {
        *(uint *)((long)&pIVar24->Flags + lVar17) = uVar22 | 0x40000000;
      }
      fVar31 = *(float *)((long)&pIVar24->WidthRequest + lVar17);
      uVar22 = -(uint)(table->MinColumnWidth <= fVar31);
      fVar31 = (float)(int)(float)(~uVar22 & (uint)table->MinColumnWidth | (uint)fVar31 & uVar22);
      *(float *)((long)&pIVar24->WidthGiven + lVar17) = fVar31;
      fVar30 = fVar30 + fVar31;
      table->ColumnsGivenWidth = fVar30;
    }
    lVar17 = lVar17 + 0x68;
  }
  if ((((uVar12 >> 0x13 & 1) == 0) && (1.0 <= fVar33)) && (0.0 < fVar27)) {
LAB_0014443c:
    uVar14 = uVar21 & 0xffffffff;
    do {
      uVar21 = uVar21 - 1;
      if ((fVar33 < 1.0) || ((int)uVar14 < 1)) break;
      if ((table->EnabledMaskByDisplayOrder >> (uVar21 & 0x3f) & 1) != 0) {
        pIVar24 = (table->Columns).Data;
        cVar10 = (table->DisplayOrderToIndex).Data[uVar21];
        if ((pIVar24[cVar10].Flags & 8) != 0) goto LAB_00144473;
      }
      uVar14 = (ulong)((int)uVar14 - 1);
    } while( true );
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar27 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar29 = local_40.Min.y + table->LastOuterHeight;
  uVar22 = -(uint)(fVar29 <= fVar27);
  local_40.Max.y = (float)(uVar22 & (uint)fVar27 | ~uVar22 & (uint)fVar29);
  iVar20 = 0;
  bVar9 = ItemHoverable(&local_40,0);
  bVar6 = '\0' < table->FreezeColumnsCount;
  fVar27 = fVar28;
  if ('\0' < table->FreezeColumnsCount) {
    fVar27 = (table->OuterRect).Min.x;
  }
  fVar27 = (fVar27 + table->OuterPaddingX) - table->CellSpacingX1;
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar21 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar21) {
      fVar28 = (table->WorkRect).Min.x;
      fVar27 = (table->Columns).Data[table->RightMostEnabledColumn].ClipRect.Max.x;
      uVar22 = -(uint)(fVar27 <= fVar28);
      fVar28 = (float)(uVar22 & (uint)fVar28 | ~uVar22 & (uint)fVar27);
      if (((bVar9) && (table->HoveredColumnBody == -1)) && (fVar28 <= (pIVar8->IO).MousePos.x)) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
      }
      uVar22 = table->Flags;
      if (!bVar11 && (uVar22 & 1) != 0) {
        uVar22 = uVar22 & 0xfffffffe;
        table->Flags = uVar22;
      }
      if (table->RightMostStretchedColumn != -1) {
        uVar22 = uVar22 & 0xfffeffff;
        table->Flags = uVar22;
      }
      if ((uVar22 >> 0x10 & 1) != 0) {
        (table->WorkRect).Max.x = fVar28;
        (table->OuterRect).Max.x = fVar28;
        fVar27 = (table->InnerClipRect).Max.x;
        if (fVar28 <= fVar27) {
          fVar27 = fVar28;
        }
        (table->InnerClipRect).Max.x = fVar27;
      }
      pIVar5 = table->InnerWindow;
      IVar7 = (table->WorkRect).Max;
      (pIVar5->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar5->ParentWorkRect).Max = IVar7;
      fVar28 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar28;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar11 = BeginPopupEx(id,0x141);
        if (bVar11) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar22 = table->Flags;
      if (((byte)((uVar22 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar22 = table->Flags;
      }
      pIVar5 = table->InnerWindow;
      if ((uVar22 >> 0x14 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar5->DrawList,(pIVar5->ClipRect).Min,(pIVar5->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar5->DrawList,2);
      }
      return;
    }
    bVar13 = (table->DisplayOrderToIndex).Data[uVar21];
    bVar25 = true;
    if (table->FreezeRowsCount < '\x01') {
      bVar25 = (char)bVar13 < table->FreezeColumnsCount;
    }
    pIVar24 = (table->Columns).Data + (char)bVar13;
    pIVar24->NavLayerCurrent = bVar25;
    if (bVar6) {
      bVar6 = true;
      if (iVar20 == table->FreezeColumnsCount) {
        fVar27 = fVar27 + (fVar28 - (table->OuterRect).Min.x);
        goto LAB_001445a6;
      }
    }
    else {
LAB_001445a6:
      bVar6 = false;
    }
    pbVar1 = (byte *)((long)&pIVar24->Flags + 3);
    *pbVar1 = *pbVar1 & 0xf0;
    if ((table->EnabledMaskByDisplayOrder >> (uVar21 & 0x3f) & 1) == 0) {
      (pIVar24->ClipRect).Max.x = fVar27;
      (pIVar24->ClipRect).Min.x = fVar27;
      pIVar24->WorkMinX = fVar27;
      pIVar24->MaxX = fVar27;
      pIVar24->MinX = fVar27;
      pIVar24->WidthGiven = 0.0;
      (pIVar24->ClipRect).Min.y = fVar2;
      (pIVar24->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar24->ClipRect,&host_clip_rect);
      pIVar24->IsVisibleX = false;
      pIVar24->IsVisibleY = false;
      pIVar24->IsRequestOutput = false;
      pIVar24->IsSkipItems = true;
      pIVar24->ItemWidth = 1.0;
    }
    else {
      if (((bVar9) && (fVar29 = (pIVar8->IO).MousePos.x, (pIVar24->ClipRect).Min.x <= fVar29)) &&
         (fVar29 < (pIVar24->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar13;
      }
      pIVar24->MinX = fVar27;
      fVar30 = TableGetMaxColumnWidth(table,(int)(char)bVar13);
      fVar29 = pIVar24->WidthGiven;
      if (fVar30 <= pIVar24->WidthGiven) {
        fVar29 = fVar30;
      }
      fVar30 = pIVar24->WidthRequest;
      if (table->MinColumnWidth <= pIVar24->WidthRequest) {
        fVar30 = table->MinColumnWidth;
      }
      fVar31 = (float)(~-(uint)(fVar30 <= fVar29) & (uint)fVar30 |
                      (uint)fVar29 & -(uint)(fVar30 <= fVar29));
      pIVar24->WidthGiven = fVar31;
      fVar29 = table->CellPaddingX;
      fVar30 = table->CellSpacingX1;
      fVar33 = table->CellSpacingX2;
      fVar32 = fVar29 + fVar29 + fVar31 + fVar27 + fVar30 + fVar33;
      pIVar24->MaxX = fVar32;
      pIVar24->WorkMinX = fVar27 + fVar29 + fVar30;
      pIVar24->WorkMaxX = (fVar32 - fVar29) - fVar33;
      pIVar24->ItemWidth = (float)(int)(fVar31 * 0.65);
      (pIVar24->ClipRect).Min.x = fVar27;
      (pIVar24->ClipRect).Min.y = fVar2;
      (pIVar24->ClipRect).Max.x = fVar32;
      (pIVar24->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar24->ClipRect,&host_clip_rect);
      fVar29 = (pIVar24->ClipRect).Min.x;
      fVar30 = (pIVar24->ClipRect).Max.x;
      pIVar24->IsVisibleX = fVar29 < fVar30;
      pIVar24->IsVisibleY = true;
      if (fVar30 <= fVar29) {
        if (pIVar24->AutoFitQueue != '\0') goto LAB_00144751;
        bVar25 = pIVar24->CannotSkipItemsQueue != '\0';
        pIVar24->IsRequestOutput = bVar25;
        if (bVar25) goto LAB_0014475b;
      }
      else {
        table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar13 & 0x3f);
LAB_00144751:
        pIVar24->IsRequestOutput = true;
LAB_0014475b:
        table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar13 & 0x3f);
      }
      bVar25 = true;
      if (pIVar24->IsEnabled == true) {
        bVar25 = table->HostSkipItems;
      }
      pIVar24->IsSkipItems = bVar25;
      uVar22 = (uint)(fVar29 < fVar30) << 0x19 | pIVar24->Flags;
      uVar12 = uVar22 | 0x1000000;
      pIVar24->Flags = uVar12;
      if (pIVar24->SortOrder != -1) {
        uVar12 = uVar22 | 0x5000000;
        pIVar24->Flags = uVar12;
      }
      if (table->HoveredColumnBody == bVar13) {
        pIVar24->Flags = uVar12 | 0x8000000;
      }
      fVar29 = pIVar24->WorkMinX;
      pIVar24->ContentMaxXFrozen = fVar29;
      pIVar24->ContentMaxXUnfrozen = fVar29;
      pIVar24->ContentMaxXHeadersUsed = fVar29;
      pIVar24->ContentMaxXHeadersIdeal = fVar29;
      if (table->HostSkipItems == false) {
        pIVar24->AutoFitQueue = pIVar24->AutoFitQueue >> 1;
        pIVar24->CannotSkipItemsQueue = pIVar24->CannotSkipItemsQueue >> 1;
      }
      if (iVar20 < table->FreezeColumnsCount) {
        fVar30 = pIVar24->MaxX + 1.0;
        fVar29 = host_clip_rect.Max.x;
        if (fVar30 <= host_clip_rect.Max.x) {
          fVar29 = fVar30;
        }
        host_clip_rect.Min.x =
             (float)(-(uint)(fVar30 < host_clip_rect.Min.x) & (uint)host_clip_rect.Min.x |
                    ~-(uint)(fVar30 < host_clip_rect.Min.x) & (uint)fVar29);
      }
      fVar27 = fVar27 + table->CellPaddingX + table->CellPaddingX +
                        pIVar24->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
      iVar20 = iVar20 + 1;
    }
    uVar21 = uVar21 + 1;
  } while( true );
LAB_00144473:
  pIVar24[cVar10].WidthRequest = pIVar24[cVar10].WidthRequest + 1.0;
  pIVar24[cVar10].WidthGiven = pIVar24[cVar10].WidthGiven + 1.0;
  fVar33 = fVar33 + -1.0;
  goto LAB_0014443c;
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings and sort specs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsUserEnabledNextFrame = true;
        if (column->IsUserEnabled != column->IsUserEnabledNextFrame)
        {
            column->IsUserEnabled = column->IsUserEnabledNextFrame;
            table->IsSettingsDirty = true;
        }
        column->IsEnabled = column->IsUserEnabled && (column->Flags & ImGuiTableColumnFlags_Disabled) == 0;

        if (column->SortOrder != -1 && !column->IsEnabled)
            table->IsSortSpecsDirty = true;
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}